

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<223U,_Fixpp::Type::Float>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  size_t sVar2;
  undefined4 in_register_0000003c;
  char acStack_68 [8];
  char buf [64];
  
  buf._56_8_ = *__buf;
  poVar1 = std::ostream::_M_insert<unsigned_long>(CONCAT44(in_register_0000003c,__fd));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=",1);
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  acStack_68[0] = '\0';
  acStack_68[1] = '\0';
  acStack_68[2] = '\0';
  acStack_68[3] = '\0';
  acStack_68[4] = '\0';
  acStack_68[5] = '\0';
  acStack_68[6] = '\0';
  acStack_68[7] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  sprintf(acStack_68,"%-.*G",(int)buf._56_8_,0x10);
  sVar2 = strlen(acStack_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,acStack_68,sVar2);
  acStack_68[0] = 0x7c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,acStack_68,1);
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }